

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O3

JL_STATUS OutputStringObject(JlDataObject *StringObject,JlBuffer *JsonBuffer,
                            JL_OUTPUT_FLAGS OutputFlags,uint32_t StackDepth)

{
  JL_STATUS JVar1;
  size_t sVar2;
  size_t sVar3;
  char *Utf8String;
  ulong uVar4;
  char *pcVar5;
  uint32_t unicodeValue;
  char string_1 [7];
  char *string;
  size_t numBytes;
  uint32_t local_5c;
  char local_58 [16];
  char *local_48;
  size_t local_40;
  char *local_38;
  
  local_48 = (char *)0x0;
  pcVar5 = "\\\'";
  if ((OutputFlags & 8) == 0) {
    pcVar5 = "\\\"";
  }
  pcVar5 = pcVar5 + 1;
  JVar1 = JlGetObjectString(StringObject,&local_48);
  if (JVar1 == JL_STATUS_SUCCESS) {
    if (local_48 == (char *)0x0) {
      pcVar5 = "null";
      sVar3 = 4;
    }
    else {
      JVar1 = JlBufferAdd(JsonBuffer,pcVar5,1);
      if (JVar1 != JL_STATUS_SUCCESS) {
        return JVar1;
      }
      local_38 = local_48;
      sVar2 = strlen(local_48);
      if (sVar2 != 0) {
        uVar4 = 0;
        do {
          local_5c = 0;
          Utf8String = local_38 + uVar4;
          JVar1 = JlUnicodeCharFromUtf8(Utf8String,sVar2 - uVar4,&local_5c,&local_40);
          if (JVar1 != JL_STATUS_SUCCESS) {
            return JVar1;
          }
          sVar3 = local_40;
          if (local_5c - 0x20 < 0x60) {
            if (local_5c == 0x22) {
              Utf8String = "\\\"";
              sVar3 = 2;
            }
            else if (local_5c == 0x27) {
              if ((OutputFlags & 8) == 0) {
                Utf8String = "\'";
                sVar3 = 1;
              }
              else {
                Utf8String = "\\\'";
                sVar3 = 2;
              }
            }
            else if (local_5c == 0x5c) {
              Utf8String = "\\\\";
              sVar3 = 2;
            }
          }
          else if (local_5c < 0x80 || (OutputFlags & 1) != 0) {
            switch(local_5c) {
            case 8:
              Utf8String = "\\b";
              sVar3 = 2;
              break;
            case 9:
              Utf8String = "\\t";
              sVar3 = 2;
              break;
            case 10:
              Utf8String = "\\n";
              sVar3 = 2;
              break;
            default:
              if (local_5c < 0xffff) {
                local_58[4] = 0;
                local_58[5] = '\0';
                local_58[6] = '\0';
                local_58[0] = '\0';
                local_58[1] = '\0';
                local_58[2] = '\0';
                local_58[3] = '\0';
                Utf8String = local_58;
                sprintf(Utf8String,"\\u%4.4x",(ulong)local_5c);
                sVar3 = 6;
              }
              else {
                local_58[8] = '\0';
                local_58[9] = '\0';
                local_58[10] = '\0';
                local_58[0xb] = '\0';
                local_58[0xc] = '\0';
                local_58[0] = '\0';
                local_58[1] = '\0';
                local_58[2] = '\0';
                local_58[3] = '\0';
                local_58[4] = 0;
                local_58[5] = '\0';
                local_58[6] = '\0';
                local_58[7] = 0;
                Utf8String = local_58;
                sprintf(Utf8String,"\\u%4.4x\\u%4.4x",(ulong)(local_5c - 0x10000 >> 10),
                        (ulong)(local_5c & 0x3ff));
                sVar3 = 0xc;
              }
              break;
            case 0xc:
              Utf8String = "\\f";
              sVar3 = 2;
              break;
            case 0xd:
              Utf8String = "\\r";
              sVar3 = 2;
            }
          }
          JVar1 = JlBufferAdd(JsonBuffer,Utf8String,sVar3);
          uVar4 = uVar4 + local_40;
        } while ((uVar4 < sVar2) && (JVar1 == JL_STATUS_SUCCESS));
        if (JVar1 != JL_STATUS_SUCCESS) {
          return JVar1;
        }
      }
      sVar3 = 1;
    }
    JVar1 = JlBufferAdd(JsonBuffer,pcVar5,sVar3);
  }
  return JVar1;
}

Assistant:

JL_STATUS
    OutputStringObject
    (
        JlDataObject const*     StringObject,
        JlBuffer*               JsonBuffer,
        JL_OUTPUT_FLAGS         OutputFlags,
        uint32_t                StackDepth
    )
{
    JL_STATUS jlStatus;
    char const* string = NULL;
    char const* const quoteCharStr = OutputFlags & JL_OUTPUT_FLAGS_J5_SINGLE_QUOTES ? "\'" : "\"";
    bool escapeSingleQuote = (OutputFlags & JL_OUTPUT_FLAGS_J5_SINGLE_QUOTES) ? true : false;
    bool escapeNonAscii = (OutputFlags & JL_OUTPUT_FLAGS_ASCII) ? true : false;

    jlStatus = JlGetObjectString( StringObject, &string );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        if( NULL != string )
        {
            jlStatus = JlBufferAdd( JsonBuffer, quoteCharStr, 1 );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                jlStatus = OutputUtf8String( string, escapeNonAscii, escapeSingleQuote, JsonBuffer );
            }
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                jlStatus = JlBufferAdd( JsonBuffer, quoteCharStr, 1 );
            }
        }
        else
        {
            jlStatus = JlBufferAdd( JsonBuffer, "null", 4 );
        }
    }

    return jlStatus;
}